

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::BaseBuilder::_newConstPoolNode(BaseBuilder *this,ConstPoolNode **out)

{
  int iVar1;
  Error EVar2;
  Error EVar3;
  Error extraout_EAX;
  undefined4 extraout_var;
  ConstPoolNode *pCVar5;
  size_t in_RCX;
  char *__s;
  size_t sStack_38;
  Error local_c;
  char *pcVar4;
  
  *out = (ConstPoolNode *)0x0;
  if ((this->_allocator)._zone != (Zone *)0x0) {
    _newConstPoolNode();
    return local_c;
  }
  _newConstPoolNode();
  *out = (ConstPoolNode *)0x0;
  pcVar4 = __s;
  if (__s != (char *)0x0) {
    if (in_RCX == 0xffffffffffffffff) {
      in_RCX = strlen(__s);
    }
    if (in_RCX != 0) {
      iVar1 = Zone::dup(&this->_dataZone,(int)__s);
      pcVar4 = (char *)CONCAT44(extraout_var,iVar1);
      if (pcVar4 == (char *)0x0) goto LAB_00112f24;
    }
  }
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newCommentNode();
    EVar3 = extraout_EAX;
LAB_00112f3a:
    EVar2 = EVar3;
    pCVar5 = (ConstPoolNode *)0x0;
  }
  else {
    pCVar5 = (ConstPoolNode *)ZoneAllocator::_alloc(&this->_allocator,0x30,&sStack_38);
    EVar2 = 0;
    EVar3 = 0;
    if (pCVar5 == (ConstPoolNode *)0x0) goto LAB_00112f3a;
    (pCVar5->super_LabelNode).super_BaseNode.field_0.field_0._prev = (BaseNode *)0x0;
    (pCVar5->super_LabelNode).super_BaseNode.field_0.field_0._next = (BaseNode *)0x0;
    (pCVar5->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\t';
    (pCVar5->super_LabelNode).super_BaseNode.field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x1c
    ;
    (pCVar5->super_LabelNode).super_BaseNode._passData = (void *)0x0;
    (pCVar5->super_LabelNode).super_BaseNode._inlineComment = (char *)0x0;
    *(undefined8 *)((long)&(pCVar5->super_LabelNode).super_BaseNode.field_1 + 2) = 0;
    *(undefined8 *)((long)&(pCVar5->super_LabelNode).super_BaseNode.field_3 + 2) = 0;
    (pCVar5->super_LabelNode).super_BaseNode._inlineComment = pcVar4;
  }
  *out = pCVar5;
  if (pCVar5 != (ConstPoolNode *)0x0) {
    return EVar2;
  }
LAB_00112f24:
  EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseBuilder::_newConstPoolNode(ConstPoolNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<ConstPoolNode>(out));
  return registerLabelNode(*out);
}